

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor.hpp
# Opt level: O3

taylor<double,_1,_2> *
operator*(taylor<double,_1,_2> *__return_storage_ptr__,int *x,taylor<double,_1,_2> *t)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  taylor<double,_1,_2> *ptVar4;
  int i;
  int i_00;
  
  (__return_storage_ptr__->super_polynomial<double,_1,_2>).c[0] = 0.0;
  (__return_storage_ptr__->super_polynomial<double,_1,_2>).c[1] = 0.0;
  (__return_storage_ptr__->super_polynomial<double,_1,_2>).c[2] = 0.0;
  i_00 = 0;
  do {
    iVar2 = *x;
    pdVar3 = taylor<double,_1,_2>::operator[](t,i_00);
    dVar1 = *pdVar3;
    ptVar4 = (taylor<double,_1,_2> *)taylor<double,_1,_2>::operator[](__return_storage_ptr__,i_00);
    (ptVar4->super_polynomial<double,_1,_2>).c[0] = (double)iVar2 * dVar1;
    i_00 = i_00 + 1;
  } while (i_00 != 3);
  return ptVar4;
}

Assistant:

static taylor<T, Nvar, Ndeg> operator*(const S & x,
                                       const taylor<T, Nvar, Ndeg> & t) {
  taylor<T, Nvar, Ndeg> tmp;
  for (int i = 0; i < tmp.size; i++)
    tmp[i] = x * t[i];
  return tmp;
}